

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_math.cpp
# Opt level: O3

double getExpection(TRIPLERGB **mrx,int h,int w,int component,int y,int x)

{
  byte bVar1;
  int iVar2;
  int j;
  double dVar3;
  
  dVar3 = 0.0;
  iVar2 = h - y;
  if (iVar2 != 0 && y <= h) {
    do {
      j = x;
      if (x < w) {
        do {
          bVar1 = getComponent((TRIPLEBYTES **)mrx,y,j,component);
          dVar3 = dVar3 + (double)bVar1;
          j = j + 1;
        } while (w != j);
      }
      y = y + 1;
    } while (y != h);
  }
  return dVar3 / (double)((w - x) * iVar2);
}

Assistant:

double getExpection(TRIPLERGB **mrx, int h, int w, int component, int y, int x) {
    double count = 0;
    for (int i = y; i < h; i++) {
        for (int j = x; j < w; j++) {
            count += getComponent((TRIPLEBYTES **) mrx, i, j, component);
        }
    }
    return (count / ((h - y) * (w - x)));
}